

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * wabt::GetSymbolTypeName(SymbolType type)

{
  char *pcVar1;
  SymbolType type_local;
  
  pcVar1 = (char *)(*(code *)(&DAT_019a9a64 + *(int *)(&DAT_019a9a64 + (ulong)type * 4)))();
  return pcVar1;
}

Assistant:

static WABT_INLINE const char* GetSymbolTypeName(SymbolType type) {
  switch (type) {
    case SymbolType::Function:
      return "func";
    case SymbolType::Global:
      return "global";
    case SymbolType::Data:
      return "data";
    case SymbolType::Section:
      return "section";
  }
  WABT_UNREACHABLE;
}